

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O3

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyBufferFromStart<RootTable>
          (VerifierTemplate<false> *this,char *identifier,size_t start)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  
  if (0xb < this->size_) {
    if ((identifier != (char *)0x0) &&
       (iVar2 = strncmp((char *)(this->buf_ + start + 4),identifier,4), iVar2 != 0)) {
      return false;
    }
    sVar3 = VerifyOffset<unsigned_int,int>(this,start);
    if (sVar3 != 0) {
      bVar1 = RootTable::Verify((RootTable *)(this->buf_ + sVar3 + start),this);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool VerifyBufferFromStart(const char *const identifier, const size_t start) {
    // Buffers have to be of some size to be valid. The reason it is a runtime
    // check instead of static_assert, is that nested flatbuffers go through
    // this call and their size is determined at runtime.
    if (!Check(size_ >= FLATBUFFERS_MIN_BUFFER_SIZE)) return false;

    // If an identifier is provided, check that we have a buffer
    if (identifier && !Check((size_ >= 2 * sizeof(flatbuffers::uoffset_t) &&
                              BufferHasIdentifier(buf_ + start, identifier)))) {
      return false;
    }

    // Call T::Verify, which must be in the generated code for this type.
    const auto o = VerifyOffset<uoffset_t>(start);
    if (!Check(o != 0)) return false;
    if (!(reinterpret_cast<const T *>(buf_ + start + o)->Verify(*this))) {
      return false;
    }
    if (TrackVerifierBufferSize) {
      if (GetComputedSize() == 0) return false;
    }
    return true;
  }